

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

Type wabt::GetMemoryType(Type operand_type,Opcode opc)

{
  bool bVar1;
  char *__str;
  size_type sVar2;
  Address AVar3;
  Enum EVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  byte local_41;
  undefined1 local_40 [7];
  bool is_unsigned;
  string_view name;
  Opcode local_1c;
  Type TStack_18;
  Opcode opc_local;
  Type operand_type_local;
  
  local_1c.enum_ = opc.enum_;
  TStack_18 = operand_type;
  bVar1 = operator==(operand_type,I32);
  if (!bVar1) {
    stack0xffffffffffffffd4 = TStack_18;
    bVar1 = operator==(TStack_18,I64);
    if (!bVar1) {
      return TStack_18;
    }
  }
  __str = Opcode::GetName(&local_1c);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_40,__str);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
  local_58 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_40,sVar2 - 2,
                        0xffffffffffffffff);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"_u");
  local_41 = std::operator==(local_58,local_68);
  AVar3 = Opcode::GetMemorySize(&local_1c);
  if (AVar3 == 1) {
    EVar4 = I8;
    if ((local_41 & 1) != 0) {
      EVar4 = I8U;
    }
    Type::Type(&operand_type_local,EVar4);
    return operand_type_local;
  }
  if (AVar3 == 2) {
    EVar4 = I16;
    if ((local_41 & 1) != 0) {
      EVar4 = I16U;
    }
    Type::Type(&operand_type_local,EVar4);
    return operand_type_local;
  }
  if (AVar3 != 4) {
    return TStack_18;
  }
  EVar4 = I32;
  if ((local_41 & 1) != 0) {
    EVar4 = I32U;
  }
  Type::Type(&operand_type_local,EVar4);
  return operand_type_local;
}

Assistant:

inline Type GetMemoryType(Type operand_type, Opcode opc) {
  // TODO: something something SIMD.
  // TODO: this loses information of the type it is read into.
  // That may well not be the biggest deal since that is usually obvious
  // from context, if not, we should probably represent that as a cast around
  // the access, since it should not be part of the field type.
  if (operand_type == Type::I32 || operand_type == Type::I64) {
    auto name = std::string_view(opc.GetName());
    // FIXME: change into a new column in opcode.def instead?
    auto is_unsigned = name.substr(name.size() - 2) == "_u";
    switch (opc.GetMemorySize()) {
      case 1: return is_unsigned ? Type::I8U : Type::I8;
      case 2: return is_unsigned ? Type::I16U : Type::I16;
      case 4: return is_unsigned ? Type::I32U : Type::I32;
    }
  }
  return operand_type;
}